

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void __thiscall
Qentem::QTest::IsEqual<Qentem::String<char16_t>,char16_t[2]>
          (QTest *this,String<char16_t> *left,char16_t (*right) [2],unsigned_long line)

{
  char16_t *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((this->error_ == true) && (this->continue_on_error_ != true)) {
    return;
  }
  if ((*right)[0] == L'\0') {
    uVar2 = 0;
LAB_00136bb4:
    if (left->length_ == (SizeT)uVar2) {
      return;
    }
  }
  else if ((*right)[0] == *left->storage_) {
    uVar2 = 1;
    do {
      pcVar1 = *right + uVar2;
      if (*pcVar1 == L'\0') goto LAB_00136bb4;
      uVar3 = uVar2 & 0xffffffff;
      uVar2 = uVar2 + 1;
    } while (*pcVar1 == left->storage_[uVar3]);
  }
  this->error_ = true;
  PrintErrorMessage<Qentem::String<char16_t>,char16_t[2]>(this,false,left,right,line);
  return;
}

Assistant:

QENTEM_NOINLINE void IsEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left != right)) {
            error_ = true;
            QTest::PrintErrorMessage(false, left, right, line);
        }
    }